

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.cpp
# Opt level: O2

pair<bool,_unsigned_long>
celero::RunAndCatchExc
          (TestFixture *test,uint64_t threads,uint64_t calls,
          shared_ptr<celero::TestFixture::ExperimentValue> *experimentValue)

{
  int iVar1;
  undefined4 extraout_var;
  unsigned_long extraout_RAX;
  unsigned_long uVar2;
  unsigned_long uVar3;
  pair<bool,_unsigned_long> pVar4;
  __shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined4 extraout_var_00;
  
  if (ExceptionSettings::instance::settings.catchExceptions == true) {
    std::__shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_30,
                 &experimentValue->
                  super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>
                );
    iVar1 = (*test->_vptr_TestFixture[8])(test,threads,calls,local_30._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    uVar2 = extraout_RAX;
    uVar3 = CONCAT44(extraout_var,iVar1);
  }
  else {
    iVar1 = (*test->_vptr_TestFixture[8])
                      (test,threads,calls,
                       (experimentValue->
                       super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    uVar2 = CONCAT44(extraout_var_00,iVar1);
    uVar3 = uVar2;
  }
  pVar4._1_7_ = (undefined7)(uVar2 >> 8);
  pVar4.first = true;
  pVar4.second = uVar3;
  return pVar4;
}

Assistant:

std::pair<bool, uint64_t> RunAndCatchExc(TestFixture& test, uint64_t threads, uint64_t calls,
											 std::shared_ptr<celero::TestFixture::ExperimentValue> experimentValue)
	{
		if(ExceptionSettings::GetCatchExceptions() == true)
		{
#if CELERO_HAS_EXCEPTIONS
			try
			{
				return RunAndCatchSEHExc(test, threads, calls, experimentValue);
			}
			catch(const std::exception& e)
			{
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Red);
				std::cout << "C++ exception \"" << e.what() << "\"" << std::endl;
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
			}
			catch(...)
			{
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Red);
				std::cout << "Unknown C++ exception" << std::endl;
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
			}

			return std::make_pair(false, 0);
#else  // CELERO_HAS_EXCEPTIONS
			return RunAndCatchSEHExc(test, threads, calls, experimentValue.get());
#endif // CELERO_HAS_EXCEPTIONS
		}
		else
		{
			return std::make_pair(true, test.run(threads, calls, experimentValue.get()));
		}
	}